

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall mocker::ir::BasicBlock::isCompleted(BasicBlock *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  
  if ((this->insts).
      super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->insts) {
    bVar4 = false;
  }
  else {
    p_Var1 = (this->insts).
             super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    p_Var2 = p_Var1[1]._M_next;
    if (p_Var2 == (_List_node_base *)0x0) {
      bVar4 = false;
    }
    else {
      lVar3 = __dynamic_cast(p_Var2,&IRInst::typeinfo,&Terminator::typeinfo,0xfffffffffffffffe);
      bVar4 = lVar3 != 0;
    }
    if (bVar4 == false) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return bVar4;
}

Assistant:

bool BasicBlock::isCompleted() const {
  if (insts.empty())
    return false;
  return (bool)std::dynamic_pointer_cast<Terminator>(insts.back());
}